

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_widget.cpp
# Opt level: O3

void __thiscall
lsim::gui::ComponentWidget::ComponentWidget(ComponentWidget *this,ModelComponent *component_model)

{
  this->m_component = component_model;
  this->m_border = true;
  (this->m_tooltip)._M_dataplus._M_p = (pointer)&(this->m_tooltip).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_tooltip,"");
  (this->m_to_circuit).m_el[0] = (float  [2])0x3f800000;
  (this->m_to_circuit).m_el[1] = (float  [2])0x3f80000000000000;
  (this->m_to_circuit).m_el[2] = (float  [2])0x0;
  Point::Point(&this->m_half_size,0.0,0.0);
  *(undefined8 *)((long)&(this->m_draw_callback).super__Function_base._M_functor + 8) = 0;
  (this->m_draw_callback).super__Function_base._M_manager = (_Manager_type)0x0;
  this->m_icon = (ComponentIcon *)0x0;
  *(undefined8 *)&(this->m_draw_callback).super__Function_base._M_functor = 0;
  (this->m_aabb_min).x = 0.0;
  (this->m_aabb_min).y = 0.0;
  (this->m_aabb_max).x = 0.0;
  (this->m_aabb_max).y = 0.0;
  (this->m_draw_callback)._M_invoker = (_Invoker_type)0x0;
  (this->m_endpoints)._M_h._M_buckets = &(this->m_endpoints)._M_h._M_single_bucket;
  (this->m_endpoints)._M_h._M_bucket_count = 1;
  (this->m_endpoints)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_endpoints)._M_h._M_element_count = 0;
  (this->m_endpoints)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_endpoints)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_endpoints)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  build_transform(this);
  return;
}

Assistant:

ComponentWidget::ComponentWidget(ModelComponent* component_model) :
	m_component(component_model),
	m_border(true),
	m_tooltip(""),
	m_half_size(0.0f, 0.0f),
	m_icon(nullptr),
	m_draw_callback(nullptr) {
	build_transform();
}